

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

StringEqualsMatcher *
Catch::Matchers::Equals
          (StringEqualsMatcher *__return_storage_ptr__,string *str,CaseSensitive caseSensitivity)

{
  CasedString local_38;
  
  local_38.m_caseSensitivity = caseSensitivity;
  CasedString::adjustString(&local_38.m_str,&local_38,str);
  StringEqualsMatcher::StringEqualsMatcher(__return_storage_ptr__,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.m_str._M_dataplus._M_p != &local_38.m_str.field_2) {
    operator_delete(local_38.m_str._M_dataplus._M_p,local_38.m_str.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

StringEqualsMatcher Equals(std::string const &str, CaseSensitive caseSensitivity) {
            return StringEqualsMatcher(CasedString(str, caseSensitivity));
        }